

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O0

void oonf_timer_remove(oonf_timer_class *info)

{
  list_entity *plVar1;
  list_entity *plVar2;
  bool bVar3;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_timer_instance *iterator;
  oonf_timer_instance *timer;
  oonf_timer_class *info_local;
  
  bVar3 = false;
  if ((info->_node).next != (list_entity *)0x0) {
    bVar3 = (info->_node).prev != (list_entity *)0x0;
  }
  if (bVar3) {
    iterator = (oonf_timer_instance *)_timer_tree.list_head.next;
    __tempptr = (_timer_tree.list_head.next)->next;
    while ((iterator->_node).list.prev != _timer_tree.list_head.prev) {
      if (iterator->class == info) {
        oonf_timer_stop(iterator);
      }
      iterator = (oonf_timer_instance *)__tempptr;
      __tempptr = __tempptr->next;
    }
    plVar1 = (info->_node).prev;
    plVar2 = (info->_node).next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
    (info->_node).prev = (list_entity *)0x0;
    (info->_node).next = (list_entity *)0x0;
  }
  return;
}

Assistant:

void
oonf_timer_remove(struct oonf_timer_class *info) {
  struct oonf_timer_instance *timer, *iterator;

  if (!list_is_node_added(&info->_node)) {
    /* only free node if its hooked to the timer core */
    return;
  }

  avl_for_each_element_safe(&_timer_tree, timer, _node, iterator) {
    if (timer->class == info) {
      oonf_timer_stop(timer);
    }
  }

  list_remove(&info->_node);
}